

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,size_t primID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  vfloat4 a0_1;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vfloat4 a0;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  vfloat4 a;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                      super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + uVar5 * sVar8);
  pfVar2 = (float *)(pcVar7 + (uVar5 + 1) * sVar8);
  fVar12 = *pfVar2;
  fVar13 = pfVar2[1];
  fVar15 = pfVar2[2];
  pfVar3 = (float *)(pcVar7 + (uVar5 + 2) * sVar8);
  fVar16 = *pfVar3;
  fVar17 = pfVar3[1];
  fVar18 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + (uVar5 + 3) * sVar8);
  fVar14 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar23 = pfVar2[3] * fVar14;
  fVar24 = pfVar3[3] * fVar14;
  fVar25 = (fVar12 * 0.16666667 + fVar16 * 0.6666667 + *pfVar4 * 0.16666667) -
           (*pfVar1 * 0.16666667 + fVar12 * 0.6666667 + fVar16 * 0.16666667);
  fVar28 = (fVar13 * 0.16666667 + fVar17 * 0.6666667 + pfVar4[1] * 0.16666667) -
           (pfVar1[1] * 0.16666667 + fVar13 * 0.6666667 + fVar17 * 0.16666667);
  fVar29 = (fVar15 * 0.16666667 + fVar18 * 0.6666667 + pfVar4[2] * 0.16666667) -
           (pfVar1[2] * 0.16666667 + fVar15 * 0.6666667 + fVar18 * 0.16666667);
  fVar30 = (fVar23 * 0.16666667 + fVar24 * 0.6666667 + pfVar4[3] * fVar14 * 0.16666667) -
           (pfVar1[3] * fVar14 * 0.16666667 + fVar23 * 0.6666667 + fVar24 * 0.16666667);
  fVar9 = fVar28 * fVar28;
  fVar10 = fVar29 * fVar29;
  fVar11 = fVar30 * fVar30;
  fVar31 = fVar9 + fVar25 * fVar25 + fVar10;
  auVar34._0_8_ = CONCAT44(fVar9 + fVar9 + fVar11,fVar31);
  auVar34._8_4_ = fVar9 + fVar10 + fVar10;
  auVar34._12_4_ = fVar9 + fVar11 + fVar11;
  auVar33._8_4_ = auVar34._8_4_;
  auVar33._0_8_ = auVar34._0_8_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar34 = rsqrtss(auVar33,auVar34);
  fVar9 = auVar34._0_4_;
  fVar9 = fVar9 * 1.5 - fVar9 * fVar9 * fVar31 * 0.5 * fVar9;
  fVar25 = fVar9 * fVar25;
  fVar28 = fVar9 * fVar28;
  fVar29 = fVar9 * fVar29;
  fVar9 = fVar9 * fVar30;
  if (1e-18 < fVar31) {
    fVar16 = ((fVar16 * 0.5 + *pfVar4 * 0.0) - fVar12 * 0.0) - *pfVar1 * 0.5;
    fVar12 = ((fVar17 * 0.5 + pfVar4[1] * 0.0) - fVar13 * 0.0) - pfVar1[1] * 0.5;
    fVar13 = ((fVar18 * 0.5 + pfVar4[2] * 0.0) - fVar15 * 0.0) - pfVar1[2] * 0.5;
    fVar15 = ((fVar24 * 0.5 + pfVar4[3] * fVar14 * 0.0) - fVar23 * 0.0) - pfVar1[3] * fVar14 * 0.5;
    fVar14 = fVar12 * fVar25 - fVar28 * fVar16;
    fVar12 = fVar13 * fVar28 - fVar29 * fVar12;
    fVar13 = fVar16 * fVar29 - fVar25 * fVar13;
    fVar15 = fVar15 * fVar9 - fVar9 * fVar15;
  }
  else {
    fVar12 = 0.0;
    fVar13 = 1.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar25 = 0.0;
    fVar28 = 0.0;
    fVar29 = 1.0;
    fVar9 = 0.0;
  }
  fVar16 = fVar13 * fVar13;
  fVar17 = fVar14 * fVar14;
  fVar18 = fVar15 * fVar15;
  fVar10 = fVar16 + fVar12 * fVar12 + fVar17;
  auVar21._0_8_ = CONCAT44(fVar16 + fVar16 + fVar18,fVar10);
  auVar21._8_4_ = fVar16 + fVar17 + fVar17;
  auVar21._12_4_ = fVar16 + fVar18 + fVar18;
  if (fVar10 <= 1e-18) {
    fVar14 = -fVar28;
    fVar16 = -fVar29;
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    if (fVar14 * fVar14 + fVar29 * fVar29 + 0.0 <= fVar25 * fVar25 + fVar16 * fVar16 + 0.0) {
      auVar19 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar17 = (float)((uint)fVar29 & auVar19._4_4_);
    fVar16 = (float)(~auVar19._0_4_ & (uint)fVar16);
    fVar10 = (float)(~auVar19._8_4_ & (uint)fVar25 | (uint)fVar14 & auVar19._8_4_);
    fVar14 = fVar17 * fVar17;
    fVar12 = fVar10 * fVar10;
    fVar13 = fVar14 + fVar16 * fVar16 + fVar12;
    auVar27._0_8_ = CONCAT44(fVar14 + fVar14 + 0.0,fVar13);
    auVar27._8_4_ = fVar14 + fVar12 + fVar12;
    auVar27._12_4_ = fVar14 + 0.0 + 0.0;
    auVar32._8_4_ = auVar27._8_4_;
    auVar32._0_8_ = auVar27._0_8_;
    auVar32._12_4_ = auVar27._12_4_;
    auVar34 = rsqrtss(auVar32,auVar27);
    fVar14 = auVar34._0_4_;
    fVar18 = fVar14 * 1.5 - fVar14 * fVar14 * fVar13 * 0.5 * fVar14;
    fVar16 = fVar18 * fVar16;
    fVar17 = fVar18 * fVar17;
    fVar10 = fVar18 * fVar10;
    fVar18 = fVar18 * 0.0;
    fVar14 = fVar17 * fVar25 - fVar28 * fVar16;
    fVar12 = fVar10 * fVar28 - fVar29 * fVar17;
    fVar13 = fVar16 * fVar29 - fVar25 * fVar10;
    fVar23 = fVar18 * fVar9 - fVar9 * fVar18;
    fVar15 = fVar12 * fVar12;
    fVar11 = fVar13 * fVar13;
    fVar24 = fVar23 * fVar23;
    fVar30 = fVar11 + fVar15 + fVar14 * fVar14;
    auVar36._0_8_ = CONCAT44(fVar24 + fVar15 + fVar15,fVar30);
    auVar36._8_4_ = fVar11 + fVar15 + fVar11;
    auVar36._12_4_ = fVar24 + fVar15 + fVar24;
    auVar20._8_4_ = auVar36._8_4_;
    auVar20._0_8_ = auVar36._0_8_;
    auVar20._12_4_ = auVar36._12_4_;
    auVar34 = rsqrtss(auVar20,auVar36);
    fVar15 = auVar34._0_4_;
    fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * fVar30 * 0.5 * fVar15;
    fVar12 = fVar15 * fVar12;
    fVar13 = fVar15 * fVar13;
    fVar14 = fVar15 * fVar14;
    fVar15 = fVar15 * fVar23;
  }
  else {
    auVar26._8_4_ = auVar21._8_4_;
    auVar26._0_8_ = auVar21._0_8_;
    auVar26._12_4_ = auVar21._12_4_;
    auVar34 = rsqrtss(auVar26,auVar21);
    fVar16 = auVar34._0_4_;
    fVar16 = fVar16 * 1.5 - fVar16 * fVar16 * fVar10 * 0.5 * fVar16;
    fVar12 = fVar12 * fVar16;
    fVar13 = fVar13 * fVar16;
    fVar14 = fVar14 * fVar16;
    fVar15 = fVar15 * fVar16;
    fVar10 = fVar28 * fVar12 - fVar13 * fVar25;
    fVar16 = fVar29 * fVar13 - fVar14 * fVar28;
    fVar17 = fVar25 * fVar14 - fVar12 * fVar29;
    fVar23 = fVar9 * fVar15 - fVar15 * fVar9;
    fVar18 = fVar16 * fVar16;
    fVar11 = fVar17 * fVar17;
    fVar24 = fVar23 * fVar23;
    fVar30 = fVar11 + fVar18 + fVar10 * fVar10;
    auVar35._0_8_ = CONCAT44(fVar24 + fVar18 + fVar18,fVar30);
    auVar35._8_4_ = fVar11 + fVar18 + fVar11;
    auVar35._12_4_ = fVar24 + fVar18 + fVar24;
    auVar22._8_4_ = auVar35._8_4_;
    auVar22._0_8_ = auVar35._0_8_;
    auVar22._12_4_ = auVar35._12_4_;
    auVar34 = rsqrtss(auVar22,auVar35);
    fVar18 = auVar34._0_4_;
    fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * fVar30 * 0.5 * fVar18;
    fVar16 = fVar18 * fVar16;
    fVar17 = fVar18 * fVar17;
    fVar10 = fVar18 * fVar10;
    fVar18 = fVar18 * fVar23;
  }
  (__return_storage_ptr__->vx).field_0.m128[0] = fVar16;
  (__return_storage_ptr__->vx).field_0.m128[1] = fVar17;
  (__return_storage_ptr__->vx).field_0.m128[2] = fVar10;
  (__return_storage_ptr__->vx).field_0.m128[3] = fVar18;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar12;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar13;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar14;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar15;
  (__return_storage_ptr__->vz).field_0.m128[0] = fVar25;
  (__return_storage_ptr__->vz).field_0.m128[1] = fVar28;
  (__return_storage_ptr__->vz).field_0.m128[2] = fVar29;
  (__return_storage_ptr__->vz).field_0.m128[3] = fVar9;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);
        
        const Curve3ff curve = getCurveScaledRadius(primID);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }